

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.h
# Opt level: O0

void __thiscall FIX::FileLogFactory::~FileLogFactory(FileLogFactory *this)

{
  FileLogFactory *this_local;
  
  *(undefined ***)this = &PTR__FileLogFactory_0030bb20;
  SessionSettings::~SessionSettings(&this->m_settings);
  std::__cxx11::string::~string((string *)&this->m_backupPath);
  std::__cxx11::string::~string((string *)&this->m_path);
  LogFactory::~LogFactory(&this->super_LogFactory);
  return;
}

Assistant:

FileLogFactory( const SessionSettings& settings )
: m_settings( settings ), m_globalLog(0), m_globalLogCount(0) {}